

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_machoread.c
# Opt level: O3

int macho_get_section_info
              (void *obj,Dwarf_Unsigned section_index,Dwarf_Obj_Access_Section_a *return_section,
              int *error)

{
  undefined1 auVar1 [16];
  long lVar2;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [16];
  
  iVar3 = -1;
  if (section_index < *(ulong *)((long)obj + 200)) {
    lVar2 = *(long *)((long)obj + 0xd0);
    lVar4 = section_index * 0xa0;
    return_section->as_name = *(char **)(lVar2 + 0x30 + lVar4);
    return_section->as_type = 0;
    return_section->as_flags = *(Dwarf_Unsigned *)(lVar2 + 0x68 + lVar4);
    return_section->as_addr = *(Dwarf_Addr *)(lVar2 + 0x38 + lVar4);
    auVar1 = *(undefined1 (*) [16])(lVar2 + 0x40 + lVar4);
    auVar5._0_8_ = auVar1._8_8_;
    auVar5._8_4_ = auVar1._0_4_;
    auVar5._12_4_ = auVar1._4_4_;
    return_section->as_offset = auVar5._0_8_;
    return_section->as_size = auVar5._8_8_;
    return_section->as_link = 0;
    return_section->as_info = 0;
    return_section->as_addralign = 0;
    return_section->as_entrysize = 0;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int macho_get_section_info (void *obj,
    Dwarf_Unsigned section_index,
    Dwarf_Obj_Access_Section_a *return_section,
    int *error)
{
    dwarf_macho_object_access_internals_t *macho =
        (dwarf_macho_object_access_internals_t*)(obj);

    (void)error;
    if (section_index < macho->mo_dwarf_sectioncount) {
        struct generic_macho_section *sp = 0;

        sp = macho->mo_dwarf_sections + section_index;
        return_section->as_name   = sp->dwarfsectname;
        return_section->as_type   = 0;
        return_section->as_flags  = sp->flags;
        return_section->as_addr   = sp->addr;
        return_section->as_offset = sp->offset;
        return_section->as_size   = sp->size;
        return_section->as_link   = 0;
        return_section->as_info   = 0;
        return_section->as_addralign = 0;
        return_section->as_entrysize = 0;
        return DW_DLV_OK;
    }
    return DW_DLV_NO_ENTRY;
}